

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O3

SchemaEntry * __thiscall
rapidjson::internal::Stack<rapidjson::CrtAllocator>::
PushUnsafe<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::SchemaEntry>
          (Stack<rapidjson::CrtAllocator> *this,size_t count)

{
  SchemaEntry *pSVar1;
  
  pSVar1 = (SchemaEntry *)this->stackTop_;
  if (pSVar1 == (SchemaEntry *)0x0) {
    __assert_fail("stackTop_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                  ,0x82,
                  "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>::SchemaEntry]"
                 );
  }
  if ((long)(count * 0x48) <= (long)this->stackEnd_ - (long)pSVar1) {
    this->stackTop_ = (char *)(pSVar1 + count);
    return pSVar1;
  }
  __assert_fail("static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                ,0x83,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>::SchemaEntry]"
               );
}

Assistant:

RAPIDJSON_FORCEINLINE T* PushUnsafe(size_t count = 1) {
        RAPIDJSON_ASSERT(stackTop_);
        RAPIDJSON_ASSERT(static_cast<std::ptrdiff_t>(sizeof(T) * count) <= (stackEnd_ - stackTop_));
        T* ret = reinterpret_cast<T*>(stackTop_);
        stackTop_ += sizeof(T) * count;
        return ret;
    }